

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_catcher_test.cpp
# Opt level: O3

void __thiscall
AllCatcher_Tests::Test_that_all_catcher_with_differnt_fail_code_types_works::test_method
          (Test_that_all_catcher_with_differnt_fail_code_types_works *this)

{
  undefined4 *puVar1;
  GenericExceptionHandler<void,_mittens::UnHandler<bool>,_mittens::DefaultNoAction<void>_> catcher;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_all_catcher_with_differnt_fail_code_types_works)
{
   {
      auto catcher = all_catcher(false); // use bool fail code type

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(false, catcher.handleException());
      }
   }

   {
      auto catcher = all_catcher(0.7); // use float fail code type

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(0.7, catcher.handleException());
      }
   }
}